

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fast_algo_struct.c
# Opt level: O1

void histprune_update_histbinsize(histprune_t *h,int32 hmmhistbinsize,int32 numNodes)

{
  int32 *piVar1;
  
  h->hmm_hist_binsize = hmmhistbinsize;
  h->hmm_hist_bins = numNodes / hmmhistbinsize + 1;
  piVar1 = (int32 *)__ckd_realloc__(h->hmm_hist,(long)(numNodes / hmmhistbinsize) * 4 + 4,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/fast_algo_struct.c"
                                    ,0x173);
  h->hmm_hist = piVar1;
  return;
}

Assistant:

void
histprune_update_histbinsize(histprune_t * h,
                             int32 hmmhistbinsize, int32 numNodes)
{
    int32 n;
    h->hmm_hist_binsize = hmmhistbinsize;
    n = numNodes;
    n /= h->hmm_hist_binsize;

    h->hmm_hist_bins = n + 1;

    h->hmm_hist =
        (int32 *) ckd_realloc(h->hmm_hist,
                              h->hmm_hist_bins * sizeof(int32));
}